

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O1

parser_error parse_artifact_alloc(parser *p)

{
  wchar_t wVar1;
  errr eVar2;
  parser_error pVar3;
  void *pvVar4;
  char *range;
  wchar_t amax;
  wchar_t amin;
  uint local_20;
  uint local_1c;
  
  pvVar4 = parser_priv(p);
  range = parser_getstr(p,"minmax");
  if (pvVar4 == (void *)0x0) {
    pVar3 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    wVar1 = parser_getint(p,"common");
    *(wchar_t *)((long)pvVar4 + 0xf4) = wVar1;
    eVar2 = grab_int_range((int *)&local_1c,(int *)&local_20,range,"to");
    pVar3 = PARSE_ERROR_INVALID_ALLOCATION;
    if (eVar2 == 0) {
      pVar3 = PARSE_ERROR_OUT_OF_BOUNDS;
      if (local_20 < 0x100 && local_1c < 0x100) {
        *(uint *)((long)pvVar4 + 0xf8) = local_1c;
        *(uint *)((long)pvVar4 + 0xfc) = local_20;
        pVar3 = PARSE_ERROR_NONE;
      }
    }
  }
  return pVar3;
}

Assistant:

static enum parser_error parse_artifact_alloc(struct parser *p) {
	struct artifact *a = parser_priv(p);
	const char *tmp = parser_getstr(p, "minmax");
	int amin, amax;

	if (!a) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	a->alloc_prob = parser_getint(p, "common");
	if (grab_int_range(&amin, &amax, tmp, "to")) {
		return PARSE_ERROR_INVALID_ALLOCATION;
	}
	if (amin > 255 || amax > 255 || amin < 0 || amax < 0) {
		return PARSE_ERROR_OUT_OF_BOUNDS;
	}
	a->alloc_min = amin;
	a->alloc_max = amax;
	return PARSE_ERROR_NONE;
}